

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Stack.h
# Opt level: O1

void __thiscall w3Stack::push_label(w3Stack *this,w3StackValue *value)

{
  pointer *ppwVar1;
  iterator __position;
  Value VVar2;
  w3Frame *pwVar3;
  size_t sVar4;
  w3Tag wVar5;
  undefined7 uVar6;
  w3Tag wVar7;
  undefined7 uVar8;
  undefined8 extraout_RAX;
  string local_28;
  
  if (value->tag != Tag_Label) {
    StringFormat_abi_cxx11_(&local_28,"%X %X",(ulong)value->tag,0x81);
    AssertFailedFormat("value.tag == Tag_Label",&local_28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  __position._M_current =
       (this->super_w3StackBase).super_w3StackBaseBase.
       super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current !=
      (this->super_w3StackBase).super_w3StackBaseBase.
      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    wVar5 = value->tag;
    uVar6 = *(undefined7 *)&value->field_0x1;
    wVar7 = (value->value).tag;
    uVar8 = *(undefined7 *)&(value->value).field_0x1;
    VVar2 = (value->value).value;
    pwVar3 = value->frame;
    sVar4 = (value->label).continuation;
    ((__position._M_current)->label).arity = (value->label).arity;
    ((__position._M_current)->label).continuation = sVar4;
    ((__position._M_current)->value).value = VVar2;
    (__position._M_current)->frame = pwVar3;
    (__position._M_current)->tag = wVar5;
    *(undefined7 *)&(__position._M_current)->field_0x1 = uVar6;
    ((__position._M_current)->value).tag = wVar7;
    *(undefined7 *)&((__position._M_current)->value).field_0x1 = uVar8;
    ppwVar1 = &(this->super_w3StackBase).super_w3StackBaseBase.
               super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppwVar1 = *ppwVar1 + 1;
    return;
  }
  std::vector<w3StackValue,std::allocator<w3StackValue>>::_M_realloc_insert<w3StackValue_const&>
            ((vector<w3StackValue,std::allocator<w3StackValue>> *)this,__position,value);
  return;
}

Assistant:

void push_label (const w3StackValue& value)
    {
        AssertFormat (value.tag == Tag_Label, ("%X %X", value.tag, Tag_Label));
        push (value);
        //printf ("push_label depth:%" FORMAT_SIZE "X\n", size ());
    }